

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O2

void av1_calc_indices_dim1_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  int j;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  if (dist != (int64_t *)0x0) {
    *dist = 0;
  }
  uVar7 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar7;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    uVar2 = (ushort)((int)data[uVar7] - (int)*centroids);
    uVar3 = -uVar2;
    if (0 < (int)data[uVar7] - (int)*centroids) {
      uVar3 = uVar2;
    }
    uVar8 = (uint)uVar3;
    indices[uVar7] = '\0';
    for (lVar4 = 1; lVar4 < k; lVar4 = lVar4 + 1) {
      uVar5 = (int)data[uVar7] - (int)centroids[lVar4];
      uVar1 = -uVar5;
      if (0 < (int)uVar5) {
        uVar1 = uVar5;
      }
      if ((uVar1 & 0xffff) < uVar8) {
        indices[uVar7] = (uint8_t)lVar4;
        uVar8 = uVar1 & 0xffff;
      }
    }
    if (dist != (int64_t *)0x0) {
      *dist = *dist + (ulong)(uVar8 * uVar8);
    }
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}